

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

uint8_t av1_get_spatial_seg_pred(AV1_COMMON *cm,MACROBLOCKD *xd,int *cdf_index,int skip_over4x4)

{
  int mi_row_00;
  int mi_col_00;
  uint8_t *segment_ids;
  int iVar1;
  CommonModeInfoParams *mi_params_00;
  int in_ECX;
  undefined4 *in_RDX;
  int *in_RSI;
  long in_RDI;
  uint8_t *seg_map;
  CommonModeInfoParams *mi_params;
  int mi_col;
  int mi_row;
  uint8_t prev_u;
  uint8_t prev_l;
  uint8_t prev_ul;
  int step_size;
  uint8_t local_2b;
  uint8_t local_2a;
  uint8_t local_29;
  uint8_t local_1;
  
  iVar1 = 1;
  if (in_ECX != 0) {
    iVar1 = 2;
  }
  local_29 = 0xff;
  local_2a = 0xff;
  local_2b = 0xff;
  mi_row_00 = *in_RSI;
  mi_col_00 = in_RSI[1];
  mi_params_00 = (CommonModeInfoParams *)(in_RDI + 0x208);
  segment_ids = *(uint8_t **)(*(long *)(in_RDI + 0xe8) + 0x50);
  if (((*(byte *)(in_RSI + 0x7b0) & 1) != 0) && ((*(byte *)((long)in_RSI + 0x1ec1) & 1) != 0)) {
    local_29 = get_segment_id(mi_params_00,segment_ids,BLOCK_4X4,mi_row_00 - iVar1,mi_col_00 - iVar1
                             );
  }
  if ((*(byte *)(in_RSI + 0x7b0) & 1) != 0) {
    local_2b = get_segment_id(mi_params_00,segment_ids,BLOCK_4X4,mi_row_00 - iVar1,mi_col_00);
  }
  if ((*(byte *)((long)in_RSI + 0x1ec1) & 1) != 0) {
    local_2a = get_segment_id(mi_params_00,segment_ids,BLOCK_4X4,mi_row_00,mi_col_00 - iVar1);
  }
  if (local_29 == 0xff) {
    *in_RDX = 0;
  }
  else if ((local_29 == local_2b) && (local_29 == local_2a)) {
    *in_RDX = 2;
  }
  else if ((local_29 == local_2b) || ((local_29 == local_2a || (local_2b == local_2a)))) {
    *in_RDX = 1;
  }
  else {
    *in_RDX = 0;
  }
  local_1 = local_2a;
  if (local_2b == 0xff) {
    if (local_2a == 0xff) {
      local_1 = '\0';
    }
  }
  else if (local_2a == 0xff) {
    local_1 = local_2b;
  }
  else if (local_29 == local_2b) {
    local_1 = local_2b;
  }
  return local_1;
}

Assistant:

static inline uint8_t av1_get_spatial_seg_pred(const AV1_COMMON *const cm,
                                               const MACROBLOCKD *const xd,
                                               int *cdf_index,
                                               int skip_over4x4) {
  const int step_size = skip_over4x4 ? 2 : 1;
  uint8_t prev_ul = UINT8_MAX;  // top left segment_id
  uint8_t prev_l = UINT8_MAX;   // left segment_id
  uint8_t prev_u = UINT8_MAX;   // top segment_id
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const uint8_t *seg_map = cm->cur_frame->seg_map;
  if ((xd->up_available) && (xd->left_available)) {
    prev_ul = get_segment_id(mi_params, seg_map, BLOCK_4X4, mi_row - step_size,
                             mi_col - step_size);
  }
  if (xd->up_available) {
    prev_u = get_segment_id(mi_params, seg_map, BLOCK_4X4, mi_row - step_size,
                            mi_col - 0);
  }
  if (xd->left_available) {
    prev_l = get_segment_id(mi_params, seg_map, BLOCK_4X4, mi_row - 0,
                            mi_col - step_size);
  }
  assert(IMPLIES(prev_ul != UINT8_MAX,
                 prev_u != UINT8_MAX && prev_l != UINT8_MAX));

  // Pick CDF index based on number of matching/out-of-bounds segment IDs.
  if (prev_ul == UINT8_MAX) /* Edge cases */
    *cdf_index = 0;
  else if ((prev_ul == prev_u) && (prev_ul == prev_l))
    *cdf_index = 2;
  else if ((prev_ul == prev_u) || (prev_ul == prev_l) || (prev_u == prev_l))
    *cdf_index = 1;
  else
    *cdf_index = 0;

  // If 2 or more are identical returns that as predictor, otherwise prev_l.
  if (prev_u == UINT8_MAX)  // edge case
    return prev_l == UINT8_MAX ? 0 : prev_l;
  if (prev_l == UINT8_MAX)  // edge case
    return prev_u;
  return (prev_ul == prev_u) ? prev_u : prev_l;
}